

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O1

int __thiscall OctetType::serialise(OctetType *this,uint8_t *buf,size_t max_len)

{
  ulong uVar1;
  uint8_t *puVar2;
  int iVar3;
  ulong uVar4;
  
  uVar1 = (this->_value)._M_string_length;
  uVar4 = 0xffffffe1;
  if (1 < max_len) {
    *buf = (char)(this->super_BER_CONTAINER)._type;
    puVar2 = buf + 1;
    iVar3 = 1;
    if (0x7f < uVar1) {
      if (uVar1 < 0x101) {
        *puVar2 = 0x81;
        puVar2 = buf + 2;
        iVar3 = 2;
      }
      else {
        *puVar2 = 0x82;
        buf[2] = (uint8_t)(uVar1 >> 8);
        puVar2 = buf + 3;
        iVar3 = 3;
      }
    }
    *puVar2 = (uint8_t)uVar1;
    uVar4 = 0xffffffe1;
    if (uVar1 + (iVar3 + 1U) <= max_len) {
      uVar4 = (ulong)(iVar3 + 1U);
    }
  }
  iVar3 = (int)uVar4;
  if (-1 < iVar3) {
    memcpy(buf + uVar4,(this->_value)._M_dataplus._M_p,(this->_value)._M_string_length);
    iVar3 = ((int)(buf + uVar4) + (int)(this->_value)._M_string_length) - (int)buf;
  }
  return iVar3;
}

Assistant:

int OctetType::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len, _value.length());
    CHECK_ENCODE_ERR(i);
    uint8_t *ptr = buf + i;

    memcpy(ptr, _value.data(), _value.length());
    ptr += _value.length();

    return ptr - buf;
}